

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

Frame * rw::findUnattachedById(HAnimHierarchy *hier,Frame *f,int32 id)

{
  int32 iVar1;
  HAnimData *pHVar2;
  Frame *ff;
  HAnimData *hanim;
  int32 id_local;
  Frame *f_local;
  HAnimHierarchy *hier_local;
  
  if (f == (Frame *)0x0) {
    hier_local = (HAnimHierarchy *)0x0;
  }
  else {
    pHVar2 = HAnimData::get(f);
    if ((((pHVar2->id < 0) || (pHVar2->id != id)) ||
        (iVar1 = HAnimHierarchy::getIndex(hier,f), hier_local = (HAnimHierarchy *)f, iVar1 != -1))
       && (hier_local = (HAnimHierarchy *)findUnattachedById(hier,f->next,id),
          (Frame *)hier_local == (Frame *)0x0)) {
      hier_local = (HAnimHierarchy *)findUnattachedById(hier,f->child,id);
    }
  }
  return (Frame *)hier_local;
}

Assistant:

static Frame*
findUnattachedById(HAnimHierarchy *hier, Frame *f, int32 id)
{
	if(f == nil) return nil;
	HAnimData *hanim = HAnimData::get(f);
	if(hanim->id >= 0 && hanim->id == id && hier->getIndex(f) == -1) return f;
	Frame *ff = findUnattachedById(hier, f->next, id);
	if(ff) return ff;
	return findUnattachedById(hier, f->child, id);
}